

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

void xc_func_set_ext_params(xc_func_type *p,double *ext_params)

{
  double dVar1;
  long in_RSI;
  long *in_RDI;
  int ii;
  undefined8 local_20;
  int local_14;
  
  for (local_14 = 0; local_14 < *(int *)(*in_RDI + 0x50); local_14 = local_14 + 1) {
    dVar1 = *(double *)(in_RSI + (long)local_14 * 8);
    if ((dVar1 != -999998888.0) || (NAN(dVar1))) {
      local_20 = *(undefined8 *)(in_RSI + (long)local_14 * 8);
    }
    else {
      local_20 = *(undefined8 *)(*(long *)(*in_RDI + 0x68) + (long)local_14 * 8);
    }
    *(undefined8 *)(in_RDI[0x2e] + (long)local_14 * 8) = local_20;
  }
  (**(code **)(*in_RDI + 0x70))(in_RDI,in_RDI[0x2e]);
  return;
}

Assistant:

void
xc_func_set_ext_params(xc_func_type *p, const double *ext_params)
{
  int ii;

  assert(p->info->ext_params.n > 0);
  /* We always store the current parameters in the functional instance */
  for(ii=0; ii<p->info->ext_params.n; ii++)
    p->ext_params[ii] = (ext_params[ii] == XC_EXT_PARAMS_DEFAULT) ? p->info->ext_params.values[ii] : ext_params[ii];
  /* Update the parameters */
  p->info->ext_params.set(p, p->ext_params);
}